

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

Expression cnn::expr::pickrange(Expression *x,uint v,uint u)

{
  undefined8 extraout_RDX;
  uint *in_RSI;
  ComputationGraph *in_RDI;
  Expression EVar1;
  initializer_list<cnn::VariableIndex> *unaff_retaddr;
  ComputationGraph *in_stack_00000008;
  ComputationGraph *pg;
  ComputationGraph *this;
  VariableIndex local_34;
  VariableIndex *local_30;
  undefined8 local_28;
  ComputationGraph *side_information;
  
  pg = *(ComputationGraph **)in_RSI;
  this = in_RDI;
  side_information = in_RDI;
  VariableIndex::VariableIndex(&local_34,(VariableIndex *)(in_RSI + 2));
  local_30 = &local_34;
  local_28 = 1;
  ComputationGraph::add_function<cnn::PickRange,unsigned_int&,unsigned_int&>
            (in_stack_00000008,unaff_retaddr,(uint *)side_information,in_RSI);
  Expression::Expression((Expression *)this,pg,(VariableIndex *)in_RDI);
  EVar1._8_8_ = extraout_RDX;
  EVar1.pg = this;
  return EVar1;
}

Assistant:

Expression pickrange(const Expression& x, unsigned v, unsigned u) { return Expression(x.pg, x.pg->add_function<PickRange>({x.i}, v, u)); }